

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O3

void __thiscall
slang::ast::CheckerInstanceSymbol::visitExprs<Visitor&>(CheckerInstanceSymbol *this,Result *visitor)

{
  Expression *this_00;
  long lVar1;
  variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
  *pvVar2;
  span<const_slang::ast::CheckerInstanceSymbol::Connection,_18446744073709551615UL> sVar3;
  anon_class_8_1_9f2c674e local_30;
  
  sVar3 = getPortConnections(this);
  if (sVar3._M_extent._M_extent_value._M_extent_value != 0) {
    pvVar2 = &(sVar3._M_ptr)->actual;
    lVar1 = sVar3._M_extent._M_extent_value._M_extent_value * 0x48;
    do {
      if (((Connection *)(pvVar2 + -1))->formal->kind == FormalArgument) {
        local_30.visitor = visitor;
        (*std::__detail::__variant::
          __gen_vtable<std::__detail::__variant::__deduce_visit_result<void>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/../include/slang/ast/ASTVisitor.h:427:17)_&&,_const_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_&>
          ::_S_vtable._M_arr
          [(pvVar2->
           super__Variant_base<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
           ).
           super__Move_assign_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
           .
           super__Copy_assign_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
           .
           super__Move_ctor_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
           .
           super__Copy_ctor_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
           .
           super__Variant_storage_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
           ._M_index]._M_data)(&local_30,pvVar2);
      }
      this_00 = Connection::getOutputInitialExpr((Connection *)(pvVar2 + -1));
      if (this_00 != (Expression *)0x0) {
        Expression::visitExpression<slang::ast::Expression_const,Visitor&>(this_00,this_00,visitor);
      }
      pvVar2 = (variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                *)((long)&pvVar2[4].
                          super__Variant_base<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                          .
                          super__Move_assign_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                          .
                          super__Copy_assign_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                          .
                          super__Move_ctor_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                          .
                          super__Copy_ctor_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                  + 8);
      lVar1 = lVar1 + -0x48;
    } while (lVar1 != 0);
  }
  return;
}

Assistant:

void CheckerInstanceSymbol::visitExprs(TVisitor&& visitor) const {
    for (auto& conn : getPortConnections()) {
        // Note: we only visit output arguments here, since input arguments
        // get rewritten into the checker instance body.
        if (conn.formal.kind == SymbolKind::FormalArgument) {
            std::visit(
                [&](auto&& arg) {
                    if (arg)
                        arg->visit(visitor);
                },
                conn.actual);
        }
        if (auto expr = conn.getOutputInitialExpr())
            expr->visit(visitor);
    }
}